

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestResults.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_26dba::TestRecordsNumberOfFailedTests::RunImpl
          (TestRecordsNumberOfFailedTests *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  TestDetails local_60;
  int local_3c [5];
  undefined1 local_28 [8];
  TestResults results;
  TestRecordsNumberOfFailedTests *this_local;
  
  results._16_8_ = this;
  UnitTest::TestResults::TestResults((TestResults *)local_28,(TestReporter *)0x0);
  UnitTest::TestResults::OnTestStart
            ((TestResults *)local_28,(TestDetails *)(anonymous_namespace)::details);
  UnitTest::TestResults::OnTestFailure
            ((TestResults *)local_28,(TestDetails *)(anonymous_namespace)::details,"");
  UnitTest::TestResults::OnTestFinish
            ((TestResults *)local_28,(TestDetails *)(anonymous_namespace)::details,0.0);
  UnitTest::TestResults::OnTestStart
            ((TestResults *)local_28,(TestDetails *)(anonymous_namespace)::details);
  UnitTest::TestResults::OnTestFailure
            ((TestResults *)local_28,(TestDetails *)(anonymous_namespace)::details,"");
  UnitTest::TestResults::OnTestFailure
            ((TestResults *)local_28,(TestDetails *)(anonymous_namespace)::details,"");
  UnitTest::TestResults::OnTestFailure
            ((TestResults *)local_28,(TestDetails *)(anonymous_namespace)::details,"");
  UnitTest::TestResults::OnTestFinish
            ((TestResults *)local_28,(TestDetails *)(anonymous_namespace)::details,0.0);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_3c[1] = 2;
  local_3c[0] = UnitTest::TestResults::GetFailedTestCount((TestResults *)local_28);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_60,*ppTVar2,0x37);
  UnitTest::CheckEqual<int,int>(results_00,local_3c + 1,local_3c,&local_60);
  return;
}

Assistant:

TEST(RecordsNumberOfFailedTests)
{
    TestResults results;

    results.OnTestStart(details);
    results.OnTestFailure(details, "");
    results.OnTestFinish(details, 0);

    results.OnTestStart(details);
    results.OnTestFailure(details, "");
    results.OnTestFailure(details, "");
    results.OnTestFailure(details, "");
    results.OnTestFinish(details, 0);

    CHECK_EQUAL (2, results.GetFailedTestCount());
}